

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

bool isEmptyBlockAfterTable(QTextBlock *block,QTextFrame *previousFrame)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTextTable *pQVar4;
  QTextBlock *in_RSI;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  uint uVar5;
  uint uVar6;
  
  pQVar4 = qobject_cast<QTextTable_const*>((QObject *)0x7ff648);
  in_stack_ffffffffffffffec = in_stack_ffffffffffffffec & 0xffffff;
  uVar6 = in_stack_ffffffffffffffec;
  if (pQVar4 != (QTextTable *)0x0) {
    bVar1 = QTextBlock::isValid(in_RSI);
    uVar5 = in_stack_ffffffffffffffec & 0xffffff;
    uVar6 = uVar5;
    if (bVar1) {
      iVar2 = QTextBlock::length((QTextBlock *)
                                 (CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8) &
                                 0xffffffffffffff));
      uVar6 = uVar5 & 0xffffff;
      if (iVar2 == 1) {
        iVar2 = QTextFrame::lastPosition
                          ((QTextFrame *)
                           (CONCAT44(uVar5,in_stack_ffffffffffffffe8) & 0xffffffffffffff));
        iVar3 = QTextBlock::position((QTextBlock *)CONCAT44(uVar6,iVar2));
        uVar6 = (uint)(iVar2 == iVar3 + -1) << 0x18;
      }
    }
  }
  return SUB41(uVar6 >> 0x18,0);
}

Assistant:

static inline bool isEmptyBlockAfterTable(const QTextBlock &block, const QTextFrame *previousFrame)
{
    return qobject_cast<const QTextTable *>(previousFrame)
           && block.isValid()
           && block.length() == 1
           && previousFrame->lastPosition() == block.position() - 1
           ;
}